

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eddsa.c
# Opt level: O0

int ossl_ed448ph_sign(OSSL_LIB_CTX *ctx,uint8_t *out_sig,uint8_t *hash,uint8_t *public_key,
                     uint8_t *private_key,uint8_t *context,size_t context_len,char *propq)

{
  c448_error_t cVar1;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  OSSL_LIB_CTX *unaff_retaddr;
  size_t in_stack_00000010;
  
  cVar1 = ossl_c448_ed448_sign_prehash
                    (unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_stack_00000010,
                     (char *)context);
  return (int)(cVar1 == C448_SUCCESS);
}

Assistant:

int
ossl_ed448ph_sign(OSSL_LIB_CTX *ctx, uint8_t *out_sig, const uint8_t hash[64],
                  const uint8_t public_key[57], const uint8_t private_key[57],
                  const uint8_t *context, size_t context_len, const char *propq)
{
    return ossl_c448_ed448_sign_prehash(ctx, out_sig, private_key, public_key,
                                        hash, context, context_len,
                                        propq) == C448_SUCCESS;
}